

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weightedgraph.cpp
# Opt level: O0

ostream * libDAI::operator<<(ostream *os,DEdgeVec *rt)

{
  ostream *poVar1;
  ostream *poVar2;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *in_RSI;
  DEdge *in_RDI;
  size_t n;
  DEdge *e;
  ostream *local_18;
  
  std::operator<<((ostream *)in_RDI,"[");
  local_18 = (ostream *)0x0;
  while( true ) {
    poVar2 = local_18;
    poVar1 = (ostream *)std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size(in_RSI);
    if (poVar1 <= poVar2) break;
    e = in_RDI;
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
              (in_RSI,(size_type)local_18);
    poVar2 = operator<<(poVar2,e);
    std::operator<<(poVar2,", ");
    local_18 = local_18 + 1;
  }
  std::operator<<((ostream *)in_RDI,"]");
  return (ostream *)in_RDI;
}

Assistant:

std::ostream & operator << (std::ostream & os, const DEdgeVec & rt) {
        os << "[";
        for( size_t n = 0; n < rt.size(); n++ )
            os << rt[n] << ", ";
        os << "]";
        return os;
    }